

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

ssize_t __thiscall
QSocks5SocketEngine::write(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  long size;
  undefined4 in_register_00000034;
  char *pcVar4;
  P _a;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_78;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0xdc) == 3) {
    QIpPacketHeader::QIpPacketHeader
              ((QIpPacketHeader *)local_58,(QHostAddress *)(lVar1 + 0xb8),*(quint16 *)(lVar1 + 0xc0)
              );
    lVar2 = (**(code **)(*(long *)this + 0x100))
                      (this,(char *)CONCAT44(in_register_00000034,__fd),__buf,
                       (QIpPacketHeader *)local_58);
    QIpPacketHeader::~QIpPacketHeader((QIpPacketHeader *)local_58);
  }
  else if (*(int *)(lVar1 + 0xdc) == 1) {
    pvVar3 = (void *)0x20000;
    if ((long)__buf < 0x20000) {
      pvVar3 = __buf;
    }
    lVar2 = (**(code **)(*(long *)**(undefined8 **)(lVar1 + 0xf8) + 0xa8))();
    size = (long)pvVar3 - lVar2;
    if (size == 0 || (long)pvVar3 < lVar2) {
      lVar2 = 0;
    }
    else {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::fromRawData
                ((QByteArray *)local_58,(char *)CONCAT44(in_register_00000034,__fd),size);
      local_78.d = (Data *)0x0;
      local_78.ptr = (char *)0x0;
      local_78.size = 0;
      QByteArray::operator=((QByteArray *)&local_78,(QByteArray *)local_58);
      pcVar4 = local_78.ptr;
      if (local_78.ptr == (char *)0x0) {
        pcVar4 = (char *)&QByteArray::_empty;
      }
      lVar2 = QIODevice::write((char *)**(undefined8 **)(lVar1 + 0xf8),(longlong)pcVar4);
      if (0 < lVar2) {
        (**(code **)(*(long *)**(undefined8 **)(lVar1 + 0xf8) + 0xc0))
                  ((long *)**(undefined8 **)(lVar1 + 0xf8),0);
        lVar2 = size;
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_58);
    }
  }
  else {
    lVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return lVar2;
}

Assistant:

qint64 QSocks5SocketEngine::write(const char *data, qint64 len)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "write" << dump(QByteArray(data, len));

    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        // clamp down the amount of bytes to transfer at once
        len = qMin<qint64>(len, MaxWriteBufferSize) - d->data->controlSocket->bytesToWrite();
        if (len <= 0)
            return 0;

        QByteArray buf = QByteArray::fromRawData(data, len);
        QByteArray sealedBuf;
        if (!d->data->authenticator->seal(buf, &sealedBuf)) {
            // ### Handle this error.
        }
        // We pass pointer and size because 'sealedBuf' is (most definitely) raw data:
        // QIODevice might have to cache the byte array if the socket cannot write the data.
        // If the _whole_ array needs to be cached then it would simply store a copy of the
        // array whose data will go out of scope and be deallocated before it can be used.
        qint64 written = d->data->controlSocket->write(sealedBuf.constData(), sealedBuf.size());

        if (written <= 0) {
            QSOCKS5_Q_DEBUG << "native write returned" << written;
            return written;
        }
        d->data->controlSocket->waitForBytesWritten(0);
        //NB: returning len rather than written for the OK case, because the "sealing" may increase the length
        return len;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        // send to connected address
        return writeDatagram(data, len, QIpPacketHeader(d->peerAddress, d->peerPort));
#endif
    }
    //### set an error ???
    return -1;
}